

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  pointer pbVar1;
  pointer pbVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  CacheEntryType CVar6;
  long lVar7;
  string *psVar8;
  long lVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  bool bVar12;
  mapped_type mVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str1;
  int iVar14;
  string *ck;
  pointer key;
  string name;
  CacheEntryType type;
  cmake *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  ulong local_108;
  string entry;
  
  this_00 = &this->DiagLevels;
  local_108 = 1;
  bVar12 = false;
  local_160 = this;
  do {
    iVar14 = (int)local_108;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= local_108)
    {
      bVar4 = true;
      if (bVar12) {
        bVar4 = FindPackage(this,args);
      }
      return bVar4;
    }
    str1 = pbVar1 + local_108;
    lVar7 = std::__cxx11::string::find((char *)str1,0x3d02fe);
    if (lVar7 == 0) {
      std::__cxx11::string::substr((ulong)&entry,(ulong)str1);
      if (entry._M_string_length == 0) {
        local_108 = (ulong)(iVar14 + 1);
        if (local_108 <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&entry);
          goto LAB_00155183;
        }
        bVar4 = false;
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
LAB_00155183:
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&entriesToDelete.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        name.field_2._M_local_buf[0] = '\0';
        entriesToDelete.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)entriesToDelete.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        type = UNINITIALIZED;
        bVar4 = cmState::ParseCacheEntry(&entry,&name,(string *)&entriesToDelete,&type);
        if (bVar4) {
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&cacheKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cacheKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          if ((this->WarnUnusedCli == true) &&
             (psVar8 = cmState::GetInitializedCacheValue(this->State,&name), psVar8 != (string *)0x0
             )) {
            bVar5 = true;
            std::__cxx11::string::_M_assign((string *)&cacheKeys);
          }
          else {
            bVar5 = false;
          }
          AddCacheEntry(this,&name,
                        (char *)entriesToDelete.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                        "No help, variable specified on the command line.",type);
          if (this->WarnUnusedCli == true) {
            if (bVar5) {
              psVar8 = cmState::GetInitializedCacheValue(this->State,&name);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cacheKeys,psVar8);
              if (!bVar5) goto LAB_001554b0;
            }
            WatchUnusedCli(this,&name);
          }
LAB_001554b0:
          std::__cxx11::string::~string((string *)&cacheKeys);
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar11 = std::operator<<(poVar11,(string *)str1);
          poVar11 = std::operator<<(poVar11,"\n");
          std::operator<<(poVar11,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        std::__cxx11::string::~string((string *)&entriesToDelete);
        std::__cxx11::string::~string((string *)&name);
      }
      psVar8 = &entry;
LAB_0015572d:
      std::__cxx11::string::~string((string *)psVar8);
      if (bVar4 == false) {
        return false;
      }
    }
    else {
      bVar4 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(str1,(char (*) [3])"-W");
      if (bVar4) {
        std::__cxx11::string::substr((ulong)&entry,(ulong)str1);
        if (entry._M_string_length == 0) {
          local_108 = (ulong)(iVar14 + 1);
          if (local_108 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&entry);
            goto LAB_00155339;
          }
          bVar4 = false;
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_00155339:
          name._M_dataplus._M_p = (pointer)&name.field_2;
          name._M_string_length = 0;
          name.field_2._M_local_buf[0] = '\0';
          lVar7 = std::__cxx11::string::find((char *)&entry,0x3d03db);
          lVar9 = std::__cxx11::string::find((char *)&entry,0x3d03df);
          std::__cxx11::string::substr((ulong)&entriesToDelete,(ulong)&entry);
          std::__cxx11::string::operator=((string *)&name,(string *)&entriesToDelete);
          std::__cxx11::string::~string((string *)&entriesToDelete);
          bVar4 = name._M_string_length != 0;
          if (name._M_string_length == 0) {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else if (lVar7 == 0 || lVar9 == 0) {
            if (lVar7 == 0 && lVar9 != 0) {
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](this_00,&name);
              *pmVar10 = DIAG_IGNORE;
            }
            else {
              if ((lVar7 == 0) || (lVar9 != 0)) {
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](this_00,&name);
                mVar13 = *pmVar10;
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](this_00,&name);
                if (0 < (int)mVar13) {
                  mVar13 = DIAG_WARN;
                }
                goto LAB_0015551e;
              }
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](this_00,&name);
              *pmVar10 = DIAG_ERROR;
            }
          }
          else {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](this_00,&name);
            mVar13 = *pmVar10;
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](this_00,&name);
            if ((int)mVar13 < 2) {
              mVar13 = DIAG_WARN;
            }
LAB_0015551e:
            *pmVar10 = mVar13;
          }
          std::__cxx11::string::~string((string *)&name);
        }
        std::__cxx11::string::~string((string *)&entry);
        this = local_160;
        if (!bVar4) {
          return false;
        }
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)str1,0x3d0400);
        if (lVar7 == 0) {
          std::__cxx11::string::substr((ulong)&name,(ulong)str1);
          if (name._M_string_length == 0) {
            local_108 = (ulong)(iVar14 + 1);
            if (local_108 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&name);
              goto LAB_00155639;
            }
            bVar4 = false;
            cmSystemTools::Error
                      ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
LAB_00155639:
            cmsys::Glob::PatternToRegex((string *)&entriesToDelete,&name,true,true);
            cmsys::RegularExpression::RegularExpression
                      ((RegularExpression *)&entry,
                       (char *)entriesToDelete.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::~string((string *)&entriesToDelete);
            entriesToDelete.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            entriesToDelete.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            entriesToDelete.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmState::GetCacheEntryKeys_abi_cxx11_(&cacheKeys,this->State);
            pbVar1 = cacheKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (key = cacheKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                pbVar2 = entriesToDelete.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                psVar8 = entriesToDelete.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, key != pbVar1; key = key + 1) {
              CVar6 = cmState::GetCacheEntryType(local_160->State,key);
              if ((CVar6 != STATIC) &&
                 (bVar4 = cmsys::RegularExpression::find((RegularExpression *)&entry,key), bVar4)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&entriesToDelete,key);
              }
            }
            for (; psVar8 != pbVar2; psVar8 = psVar8 + 1) {
              cmState::RemoveCacheEntry(local_160->State,psVar8);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&cacheKeys);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entriesToDelete);
            cmsys::RegularExpression::~RegularExpression((RegularExpression *)&entry);
            bVar4 = true;
            this = local_160;
          }
          psVar8 = &name;
          goto LAB_0015572d;
        }
        lVar7 = std::__cxx11::string::find((char *)str1,0x3d0421);
        if (lVar7 == 0) {
          std::__cxx11::string::substr((ulong)&entry,(ulong)str1);
          if (entry._M_string_length == 0) {
            local_108 = (ulong)(iVar14 + 1);
            if (local_108 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&entry);
              goto LAB_001557be;
            }
            bVar4 = false;
            cmSystemTools::Error
                      ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
LAB_001557be:
            poVar11 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
            poVar11 = std::operator<<(poVar11,(string *)&entry);
            std::operator<<(poVar11,"\n");
            bVar4 = true;
            ReadListFile(this,args,&entry);
          }
          std::__cxx11::string::~string((string *)&entry);
          bVar4 = !bVar4;
LAB_0015586d:
          if (bVar4) {
            return false;
          }
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)str1,0x3d0464);
          if (lVar7 == 0) {
            local_108 = (ulong)(iVar14 + 1);
            pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
                local_108) {
              cmSystemTools::Error
                        ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
              return false;
            }
            std::__cxx11::string::string((string *)&entry,(string *)(pbVar1 + local_108));
            sVar3 = entry._M_string_length;
            if (entry._M_string_length == 0) {
              cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
              GetProjectCommandsInScriptMode(this->State);
              ReadListFile(this,args,&entry);
            }
            std::__cxx11::string::~string((string *)&entry);
            bVar4 = sVar3 == 0;
            goto LAB_0015586d;
          }
          lVar7 = std::__cxx11::string::find((char *)str1,0x3d048b);
          bVar12 = (bool)(bVar12 | lVar7 == 0);
        }
      }
    }
    local_108 = (ulong)((int)local_108 + 1);
  } while( true );
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-D", 0) == 0) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
        }
      }
      std::string var, value;
      cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
      if (cmState::ParseCacheEntry(entry, var, value, type)) {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if (this->WarnUnusedCli) {
          if (const std::string* v =
                this->State->GetInitializedCacheValue(var)) {
            haveValue = true;
            cachedValue = *v;
          }
        }

        this->AddCacheEntry(var, value.c_str(),
                            "No help, variable specified on the command line.",
                            type);

        if (this->WarnUnusedCli) {
          if (!haveValue ||
              cachedValue != *this->State->GetInitializedCacheValue(var)) {
            this->WatchUnusedCli(var);
          }
        }
      } else {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
    } else if (cmHasLiteralPrefix(arg, "-W")) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
        }
      }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0) {
        foundNo = true;
        nameStartPosition += 3;
      }

      if (entry.find("error=", nameStartPosition) == 0) {
        foundError = true;
        nameStartPosition += 6;
      }

      name = entry.substr(nameStartPosition);
      if (name.empty()) {
        cmSystemTools::Error("No warning name provided.");
        return false;
      }

      if (!foundNo && !foundError) {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
      } else if (foundNo && !foundError) {
        // -Wno<name>
        this->DiagLevels[name] = DIAG_IGNORE;
      } else if (!foundNo && foundError) {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
      } else {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
      }
    } else if (arg.find("-U", 0) == 0) {
      std::string entryPattern = arg.substr(2);
      if (entryPattern.empty()) {
        ++i;
        if (i < args.size()) {
          entryPattern = args[i];
        } else {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
        }
      }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      // go through all cache entries and collect the vars which will be
      // removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::string const& ck : cacheKeys) {
        cmStateEnums::CacheEntryType t = this->State->GetCacheEntryType(ck);
        if (t != cmStateEnums::STATIC) {
          if (regex.find(ck)) {
            entriesToDelete.push_back(ck);
          }
        }
      }

      // now remove them from the cache
      for (std::string const& currentEntry : entriesToDelete) {
        this->State->RemoveCacheEntry(currentEntry);
      }
    } else if (arg.find("-C", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i < args.size()) {
          path = args[i];
        } else {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
        }
      }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path);
    } else if (arg.find("-P", 0) == 0) {
      i++;
      if (i >= args.size()) {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
      }
      std::string path = args[i];
      if (path.empty()) {
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
      // Register fake project commands that hint misuse in script mode.
      GetProjectCommandsInScriptMode(this->State);
      this->ReadListFile(args, path);
    } else if (arg.find("--find-package", 0) == 0) {
      findPackageMode = true;
    }
  }

  if (findPackageMode) {
    return this->FindPackage(args);
  }

  return true;
}